

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_StatusCode UA_Client_connect(UA_Client *client,char *endpointUrl)

{
  UA_UInt32 *request;
  long lVar1;
  long lVar2;
  UA_Logger p_Var3;
  undefined8 uVar4;
  UA_ConnectClientConnection p_Var5;
  UA_ConnectionConfig UVar6;
  bool bVar7;
  byte bVar8;
  UA_UInt32 UVar9;
  UA_UInt32 UVar10;
  UA_UInt32 UVar11;
  UA_UInt32 UVar12;
  UA_StatusCode UVar13;
  int iVar14;
  undefined4 extraout_var;
  long lVar15;
  char *msg;
  long lVar16;
  ulong uVar17;
  undefined8 *puVar18;
  UA_Connection *__dest;
  UA_String UVar19;
  undefined1 local_2d0 [8];
  UA_CreateSessionResponse response;
  UA_EndpointDescription *endpointArray;
  undefined1 local_b0 [32];
  undefined1 local_90 [32];
  undefined8 local_70;
  undefined4 local_68;
  long local_60;
  long local_58;
  UA_UserTokenPolicy *local_50;
  UA_Connection *local_48;
  ulong local_40;
  UA_String *local_38;
  
  UVar13 = 0;
  if (client->state != UA_CLIENTSTATE_CONNECTED) {
    if (client->state == UA_CLIENTSTATE_ERRORED) {
      UA_Client_deleteMembers(client);
      response.maxRequestMessageSize = (client->config).timeout;
      response._292_4_ = (client->config).secureChannelLifeTime;
      p_Var3 = (client->config).logger;
      UVar9 = (client->config).localConnectionConfig.protocolVersion;
      UVar10 = (client->config).localConnectionConfig.sendBufferSize;
      UVar11 = (client->config).localConnectionConfig.recvBufferSize;
      UVar12 = (client->config).localConnectionConfig.maxMessageSize;
      uVar4 = *(undefined8 *)&(client->config).localConnectionConfig.maxChunkCount;
      p_Var5 = (client->config).connectionFunc;
      memset(client,0,600);
      (client->channel).connection = &client->connection;
      (client->config).timeout = response.maxRequestMessageSize;
      (client->config).secureChannelLifeTime = response._292_4_;
      (client->config).logger = p_Var3;
      (client->config).localConnectionConfig.protocolVersion = UVar9;
      (client->config).localConnectionConfig.sendBufferSize = UVar10;
      (client->config).localConnectionConfig.recvBufferSize = UVar11;
      (client->config).localConnectionConfig.maxMessageSize = UVar12;
      *(undefined8 *)&(client->config).localConnectionConfig.maxChunkCount = uVar4;
      (client->config).connectionFunc = p_Var5;
    }
    __dest = &client->connection;
    UVar6.recvBufferSize = 0xffff;
    UVar6.maxMessageSize = 0;
    UVar6.protocolVersion = 0;
    UVar6.sendBufferSize = 0xffff;
    UVar6.maxChunkCount = 0;
    (*(client->config).connectionFunc)
              ((UA_Connection *)&response.maxRequestMessageSize,UVar6,endpointUrl,
               (client->config).logger);
    memcpy(__dest,&response.maxRequestMessageSize,0x88);
    UVar13 = 0x80ae0000;
    if ((client->connection).state == UA_CONNECTION_OPENING) {
      UVar19 = UA_String_fromChars(endpointUrl);
      client->endpointUrl = UVar19;
      if (UVar19.data == (UA_Byte *)0x0) {
        UVar13 = 0x80030000;
      }
      else {
        (client->connection).localConf.maxChunkCount =
             (client->config).localConnectionConfig.maxChunkCount;
        UVar9 = (client->config).localConnectionConfig.sendBufferSize;
        UVar10 = (client->config).localConnectionConfig.recvBufferSize;
        UVar11 = (client->config).localConnectionConfig.maxMessageSize;
        (client->connection).localConf.protocolVersion =
             (client->config).localConnectionConfig.protocolVersion;
        (client->connection).localConf.sendBufferSize = UVar9;
        (client->connection).localConf.recvBufferSize = UVar10;
        (client->connection).localConf.maxMessageSize = UVar11;
        UVar13 = HelAckHandshake(client);
        if (UVar13 == 0) {
          UVar13 = SecureChannelHandshake(client,false);
        }
        if (UVar13 == 0) {
          response.maxRequestMessageSize = 0;
          response._292_4_ = 0;
          local_2d0 = (undefined1  [8])0x0;
          UVar13 = GetEndpoints(client,(size_t *)local_2d0,
                                (UA_EndpointDescription **)&response.maxRequestMessageSize);
          if (UVar13 == 0) {
            local_38 = (UA_String *)local_2d0;
            if (local_2d0 == (undefined1  [8])0x0) {
              bVar7 = true;
              local_40 = 1;
            }
            else {
              local_60 = response._288_8_;
              local_50 = &client->token;
              puVar18 = (undefined8 *)0x0;
              local_40 = 0;
              bVar8 = 0;
              local_48 = __dest;
              do {
                lVar15 = local_60 + (long)puVar18 * 0xd8;
                lVar16 = *(long *)(local_60 + 0xc0 + (long)puVar18 * 0xd8);
                if ((((lVar16 == 0) ||
                     ((lVar16 == 0x41 &&
                      (iVar14 = bcmp(*(void **)(lVar15 + 200),
                                     "http://opcfoundation.org/UA-Profile/Transport/uatcp-uasc-uabinary"
                                     ,0x41), iVar14 == 0)))) && (*(long *)(lVar15 + 0xa0) == 0x2f))
                   && (iVar14 = bcmp(*(void **)(lVar15 + 0xa8),
                                     "http://opcfoundation.org/UA/SecurityPolicy#None",0x2f),
                      iVar14 == 0)) {
                  if (*(long *)(lVar15 + 0xb0) == 0) {
                    bVar8 = 1;
                  }
                  else {
                    lVar16 = 0;
                    uVar17 = 0;
                    local_58 = lVar15;
                    do {
                      lVar1 = *(long *)(lVar15 + 0xb8);
                      lVar2 = *(long *)(lVar1 + 0x38 + lVar16);
                      bVar7 = true;
                      if (lVar2 == 0) {
LAB_00127628:
                        bVar7 = true;
                        if (client->authenticationMethod ==
                            *(UA_Client_Authentication *)(lVar1 + 0x10 + lVar16)) {
                          UVar13 = UA_copy((void *)(lVar1 + lVar16),local_50,UA_TYPES + 0x65);
                          local_40 = CONCAT71((int7)(CONCAT44(extraout_var,UVar13) >> 8),1);
                          bVar7 = false;
                        }
                      }
                      else if (lVar2 == 0x2f) {
                        iVar14 = bcmp(*(void **)(lVar1 + 0x40 + lVar16),
                                      "http://opcfoundation.org/UA/SecurityPolicy#None",0x2f);
                        bVar7 = true;
                        lVar15 = local_58;
                        if (iVar14 == 0) goto LAB_00127628;
                      }
                      bVar8 = 1;
                      if (!bVar7) break;
                      uVar17 = uVar17 + 1;
                      lVar16 = lVar16 + 0x48;
                    } while (uVar17 < *(ulong *)(lVar15 + 0xb0));
                  }
                }
                puVar18 = (undefined8 *)((long)puVar18 + 1);
              } while ((UA_String *)puVar18 != local_38);
              bVar7 = (bool)(bVar8 ^ 1);
              local_40 = local_40 ^ 1;
              __dest = local_48;
            }
            UA_Array_delete((void *)response._288_8_,(size_t)local_38,UA_TYPES + 0x9b);
            if ((bVar7) || (UVar13 = 0, (local_40 & 1) != 0)) {
              msg = "No suitable UserTokenPolicy found for the possible endpoints";
              if (bVar7) {
                msg = "No suitable endpoint found";
              }
              UA_LOG_ERROR((client->config).logger,UA_LOGCATEGORY_CLIENT,msg);
              UVar13 = 0x80020000;
            }
          }
        }
        if (UVar13 == 0) {
          local_38 = &client->endpointUrl;
          memset(&response.maxRequestMessageSize,0,0x148);
          gettimeofday((timeval *)local_2d0,(__timezone_ptr_t)0x0);
          UA_copy(&(client->channel).clientNonce,local_90,UA_TYPES + 0xe);
          local_70 = 0x41324f8000000000;
          local_68 = 0x7fffffff;
          UA_copy(local_38,local_b0,UA_TYPES + 0xb);
          memset(local_2d0,0,0x128);
          request = &response.maxRequestMessageSize;
          __UA_Client_Service(client,request,UA_TYPES + 0x99,local_2d0,UA_TYPES + 0xa1);
          UA_copy((void *)((long)&response.sessionId.identifier + 8),&client->authenticationToken,
                  UA_TYPES + 0x10);
          UVar13 = response.responseHeader.timestamp._4_4_;
          deleteMembers_noInit(request,UA_TYPES + 0x99);
          memset(request,0,0x148);
          deleteMembers_noInit(local_2d0,UA_TYPES + 0xa1);
          memset(local_2d0,0,0x128);
        }
        if (UVar13 == 0) {
          memset(&response.maxRequestMessageSize,0,0x100);
          client->requestHandle = client->requestHandle + 1;
          gettimeofday((timeval *)local_2d0,(__timezone_ptr_t)0x0);
          if (client->authenticationMethod == UA_CLIENTAUTHENTICATION_NONE) {
            puVar18 = (undefined8 *)calloc(1,0x10);
            *puVar18 = 0;
            puVar18[1] = 0;
            UA_copy(&client->token,puVar18,UA_TYPES + 0xb);
          }
          else {
            puVar18 = (undefined8 *)calloc(1,0x40);
            *puVar18 = 0;
            puVar18[1] = 0;
            puVar18[2] = 0;
            puVar18[3] = 0;
            puVar18[4] = 0;
            puVar18[5] = 0;
            puVar18[6] = 0;
            puVar18[7] = 0;
            local_38 = (UA_String *)(puVar18 + 4);
            UA_copy(&client->token,puVar18,UA_TYPES + 0xb);
            UA_copy(&client->username,puVar18 + 2,UA_TYPES + 0xb);
            UA_copy(&client->password,local_38,UA_TYPES + 0xb);
          }
          __UA_Client_Service(client,&response.maxRequestMessageSize,UA_TYPES + 0x53,local_2d0,
                              UA_TYPES + 0x58);
          if (response.responseHeader.timestamp._4_4_ != 0) {
            lVar16 = 0;
            lVar15 = 0x142ba0;
            do {
              if (*(UA_StatusCode *)((long)&statusCodeDescriptions[0].code + lVar16) ==
                  response.responseHeader.timestamp._4_4_) {
                lVar15 = (long)&statusCodeDescriptions[0].code + lVar16;
                break;
              }
              lVar16 = lVar16 + 0x18;
            } while (lVar16 != 0x1578);
            UA_LOG_ERROR((client->config).logger,UA_LOGCATEGORY_CLIENT,
                         "ActivateSession failed with error code %s",*(undefined8 *)(lVar15 + 8));
          }
          deleteMembers_noInit(&response.maxRequestMessageSize,UA_TYPES + 0x53);
          memset(&response.maxRequestMessageSize,0,0x100);
          deleteMembers_noInit(local_2d0,UA_TYPES + 0x58);
          memset(local_2d0,0,0xb8);
          UVar13 = response.responseHeader.timestamp._4_4_;
        }
        if (UVar13 == 0) {
          (client->connection).state = UA_CONNECTION_ESTABLISHED;
          client->state = UA_CLIENTSTATE_CONNECTED;
          return 0;
        }
      }
    }
    UA_Client_deleteMembers(client);
    response.maxRequestMessageSize = (client->config).timeout;
    response._292_4_ = (client->config).secureChannelLifeTime;
    p_Var3 = (client->config).logger;
    UVar9 = (client->config).localConnectionConfig.protocolVersion;
    UVar10 = (client->config).localConnectionConfig.sendBufferSize;
    UVar11 = (client->config).localConnectionConfig.recvBufferSize;
    UVar12 = (client->config).localConnectionConfig.maxMessageSize;
    uVar4 = *(undefined8 *)&(client->config).localConnectionConfig.maxChunkCount;
    p_Var5 = (client->config).connectionFunc;
    memset(client,0,600);
    (client->channel).connection = __dest;
    (client->config).timeout = response.maxRequestMessageSize;
    (client->config).secureChannelLifeTime = response._292_4_;
    (client->config).logger = p_Var3;
    (client->config).localConnectionConfig.protocolVersion = UVar9;
    (client->config).localConnectionConfig.sendBufferSize = UVar10;
    (client->config).localConnectionConfig.recvBufferSize = UVar11;
    (client->config).localConnectionConfig.maxMessageSize = UVar12;
    *(undefined8 *)&(client->config).localConnectionConfig.maxChunkCount = uVar4;
    (client->config).connectionFunc = p_Var5;
  }
  return UVar13;
}

Assistant:

UA_StatusCode
UA_Client_connect(UA_Client *client, const char *endpointUrl) {
    if(client->state == UA_CLIENTSTATE_CONNECTED)
        return UA_STATUSCODE_GOOD;
    if(client->state == UA_CLIENTSTATE_ERRORED) {
        UA_Client_reset(client);
    }

    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    client->connection =
        client->config.connectionFunc(UA_ConnectionConfig_standard,
                                      endpointUrl, client->config.logger);
    if(client->connection.state != UA_CONNECTION_OPENING) {
        retval = UA_STATUSCODE_BADCONNECTIONCLOSED;
        goto cleanup;
    }

    client->endpointUrl = UA_STRING_ALLOC(endpointUrl);
    if(!client->endpointUrl.data) {
        retval = UA_STATUSCODE_BADOUTOFMEMORY;
        goto cleanup;
    }

    client->connection.localConf = client->config.localConnectionConfig;
    retval = HelAckHandshake(client);
    if(retval == UA_STATUSCODE_GOOD)
        retval = SecureChannelHandshake(client, false);
    if(retval == UA_STATUSCODE_GOOD)
        retval = EndpointsHandshake(client);
    if(retval == UA_STATUSCODE_GOOD)
        retval = SessionHandshake(client);
    if(retval == UA_STATUSCODE_GOOD)
        retval = ActivateSession(client);
    if(retval == UA_STATUSCODE_GOOD) {
        client->connection.state = UA_CONNECTION_ESTABLISHED;
        client->state = UA_CLIENTSTATE_CONNECTED;
    } else {
        goto cleanup;
    }
    return retval;

 cleanup:
    UA_Client_reset(client);
    return retval;
}